

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int UnixDir_Read(void *pUserData,jx9_context *pCtx)

{
  sxu32 nLen;
  dirent *pdVar1;
  char *zSrc;
  sxu32 n;
  char *zName;
  dirent *pEntry;
  DIR *pDir;
  jx9_context *pCtx_local;
  void *pUserData_local;
  
  do {
    pdVar1 = readdir((DIR *)pUserData);
    if (pdVar1 == (dirent *)0x0) {
      return -1;
    }
    zSrc = pdVar1->d_name;
    nLen = SyStrlen(zSrc);
  } while (((nLen < 3) && (*zSrc == '.')) && ((nLen != 2 || (pdVar1->d_name[1] == '.'))));
  jx9_result_string(pCtx,zSrc,nLen);
  return 0;
}

Assistant:

static int UnixDir_Read(void *pUserData, jx9_context *pCtx)
{
	DIR *pDir = (DIR *)pUserData;
	struct dirent *pEntry;
	char *zName = 0; /* cc warning */
	sxu32 n = 0;
	for(;;){
		pEntry = readdir(pDir);
		if( pEntry == 0 ){
			/* No more entries to process */
			return -1;
		}
		zName = pEntry->d_name; 
		n = SyStrlen(zName);
		/* Ignore '.' && '..' */
		if( n > sizeof("..")-1 || zName[0] != '.' || ( n == sizeof("..")-1 && zName[1] != '.') ){
			break;
		}
		/* Next entry */
	}
	/* Return the current file name */
	jx9_result_string(pCtx, zName, (int)n);
	return JX9_OK;
}